

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O0

Comm adios2::helper::CommImpl::MakeComm
               (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                *impl)

{
  __uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> in_RDI;
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
  *in_stack_ffffffffffffffb8;
  
  std::unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>::
  unique_ptr((unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> *
             )in_RDI._M_t.
              super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
              .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl,
             in_stack_ffffffffffffffb8);
  Comm::Comm((Comm *)in_RDI._M_t.
                     super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                     .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl,
             in_stack_ffffffffffffffb8);
  std::unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>::
  ~unique_ptr((unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
               *)in_RDI._M_t.
                 super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                 .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl);
  return (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>)
         (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>)
         in_RDI._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
}

Assistant:

Comm CommImpl::MakeComm(std::unique_ptr<CommImpl> impl) { return Comm(std::move(impl)); }